

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeModuleInspectLinkageExt
          (ze_linkage_inspection_ext_desc_t *pInspectDesc,uint32_t numModules,
          ze_module_handle_t *phModules,ze_module_build_log_handle_t *phLog)

{
  code *pcVar1;
  ulong uVar2;
  void *pvVar3;
  object_t<_ze_module_build_log_handle_t_*> *poVar4;
  bad_alloc *anon_var_0;
  ulong local_58;
  size_t i;
  ze_module_handle_t *phModulesLocal;
  ze_pfnModuleInspectLinkageExt_t pfnInspectLinkageExt;
  dditable_t *dditable;
  ze_module_build_log_handle_t *pp_Stack_30;
  ze_result_t result;
  ze_module_build_log_handle_t *phLog_local;
  ze_module_handle_t *phModules_local;
  ze_linkage_inspection_ext_desc_t *pzStack_18;
  uint32_t numModules_local;
  ze_linkage_inspection_ext_desc_t *pInspectDesc_local;
  
  dditable._4_4_ = 0;
  pfnInspectLinkageExt = *(ze_pfnModuleInspectLinkageExt_t *)(*phModules + 8);
  pcVar1 = *(code **)(pfnInspectLinkageExt + 0x538);
  if (pcVar1 == (code *)0x0) {
    pInspectDesc_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    uVar2 = SUB168(ZEXT416(numModules) * ZEXT816(8),0);
    if (SUB168(ZEXT416(numModules) * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pp_Stack_30 = phLog;
    phLog_local = (ze_module_build_log_handle_t *)phModules;
    phModules_local._4_4_ = numModules;
    pzStack_18 = pInspectDesc;
    pvVar3 = operator_new__(uVar2);
    for (local_58 = 0;
        phLog_local != (ze_module_build_log_handle_t *)0x0 && local_58 < phModules_local._4_4_;
        local_58 = local_58 + 1) {
      *(undefined8 *)((long)pvVar3 + local_58 * 8) = *(undefined8 *)phLog_local[local_58];
    }
    dditable._4_4_ = (*pcVar1)(pzStack_18,phModules_local._4_4_,pvVar3,pp_Stack_30);
    if (pvVar3 != (void *)0x0) {
      operator_delete__(pvVar3);
    }
    if (dditable._4_4_ == ZE_RESULT_SUCCESS) {
      poVar4 = singleton_factory_t<object_t<_ze_module_build_log_handle_t*>,_ze_module_build_log_handle_t*>
               ::getInstance<_ze_module_build_log_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_ze_module_build_log_handle_t*>,_ze_module_build_log_handle_t*>
                           *)(context + 0x4e0),pp_Stack_30,(dditable_t **)&pfnInspectLinkageExt);
      *pp_Stack_30 = (ze_module_build_log_handle_t)poVar4;
      pInspectDesc_local._4_4_ = dditable._4_4_;
    }
    else {
      pInspectDesc_local._4_4_ = dditable._4_4_;
    }
  }
  return pInspectDesc_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeModuleInspectLinkageExt(
        ze_linkage_inspection_ext_desc_t* pInspectDesc, ///< [in] pointer to linkage inspection descriptor structure.
        uint32_t numModules,                            ///< [in] number of modules to be inspected pointed to by phModules.
        ze_module_handle_t* phModules,                  ///< [in][range(0, numModules)] pointer to an array of modules to be
                                                        ///< inspected for import dependencies.
        ze_module_build_log_handle_t* phLog             ///< [out] pointer to handle of linkage inspection log. Log object will
                                                        ///< contain separate lists of imports, un-resolvable imports, and exports.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_module_object_t*>( phModules[ 0 ] )->dditable;
        auto pfnInspectLinkageExt = dditable->ze.Module.pfnInspectLinkageExt;
        if( nullptr == pfnInspectLinkageExt )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handles to driver handles
        auto phModulesLocal = new ze_module_handle_t [numModules];
        for( size_t i = 0; ( nullptr != phModules ) && ( i < numModules ); ++i )
            phModulesLocal[ i ] = reinterpret_cast<ze_module_object_t*>( phModules[ i ] )->handle;

        // forward to device-driver
        result = pfnInspectLinkageExt( pInspectDesc, numModules, phModulesLocal, phLog );
        delete []phModulesLocal;

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phLog = reinterpret_cast<ze_module_build_log_handle_t>(
                context->ze_module_build_log_factory.getInstance( *phLog, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }